

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CharacterClassPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  EncodedChar *pEVar1;
  EncodedChar *pEVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  codepoint_t cVar6;
  uint uVar7;
  ulong uVar8;
  EncodedChar EVar9;
  codepoint_t codePointValue;
  char16 local_40;
  EncodedChar local_3e;
  char16 local_3c;
  char16 local_3a;
  char16 ignore;
  Char outChar;
  char16 leftSingleChar;
  char16 rightSingleChar;
  bool previousSurrogatePart;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00eccb4d;
    *puVar5 = 0;
  }
  if (*this->next == L'^') {
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar4) goto LAB_00eccb4d;
      *puVar5 = 0;
    }
    this->next = this->next + 1;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00eccb4d;
    *puVar5 = 0;
  }
  EVar9 = *this->next;
  rightSingleChar._1_1_ = '\0';
  if (EVar9 != L']') {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    _ignore = 0xffffffff;
    codePointValue = 0xffffffff;
    uVar8 = 0xffffffff;
    do {
      pEVar1 = this->next;
      if (EVar9 == L'\\') {
        if (this->inputLim <= pEVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar4) goto LAB_00eccb4d;
          *puVar5 = 0;
        }
        pEVar1 = this->next;
        this->next = pEVar1 + 1;
        EVar9 = *pEVar1;
        if ((ulong)(ushort)EVar9 < 0x100) {
          bVar4 = (bool)((ASCIIChars::classes[(ushort)EVar9] & 2) >> 1);
        }
        else {
          bVar4 = (EVar9 & 0xfffeU) == 0x2028;
        }
        if (bVar4 != false) {
          Fail(this,-0x7ff5fc0c);
        }
        local_3e = EVar9;
        bVar4 = ClassEscapePass0(this,&local_3e,(bool *)((long)&rightSingleChar + 1));
        uVar8 = (ulong)(ushort)local_3e;
        cVar6 = codePointValue;
        if (_ignore == 0xffffffff) {
          cVar6 = 0xffffffff;
        }
        if (!bVar4) {
          uVar8 = 0xffffffff;
          codePointValue = cVar6;
        }
      }
      else if (EVar9 == L'-') {
        if ((codePointValue == 0xffffffff) && ((codepoint_t)uVar8 != 0xffffffff)) {
          codePointValue = (codepoint_t)uVar8;
          if (pEVar1 == this->positionAfterLastSurrogate) {
            codePointValue = this->valueOfLastSurrogate;
          }
          if (this->inputLim <= pEVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar4) goto LAB_00eccb4d;
            *puVar5 = 0;
          }
          pEVar1 = this->next;
          this->next = pEVar1 + 1;
          EVar9 = *pEVar1;
          if ((ulong)(ushort)EVar9 < 0x100) {
            bVar4 = (bool)((ASCIIChars::classes[(ushort)EVar9] & 2) >> 1);
          }
          else {
            bVar4 = (EVar9 & 0xfffeU) == 0x2028;
          }
          uVar8 = 0xffffffff;
          if (bVar4 != false) {
            Fail(this,-0x7ff5fc0c);
          }
        }
        else {
          if (this->inputLim <= pEVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar4) goto LAB_00eccb4d;
            *puVar5 = 0;
          }
          pEVar1 = this->next;
          this->next = pEVar1 + 1;
          EVar9 = *pEVar1;
          uVar8 = (ulong)(ushort)EVar9;
          if (uVar8 < 0x100) {
            bVar4 = (bool)((ASCIIChars::classes[uVar8] & 2) >> 1);
          }
          else {
            bVar4 = (EVar9 & 0xfffeU) == 0x2028;
          }
          if (bVar4 != false) {
            Fail(this,-0x7ff5fc0c);
          }
        }
        this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
        if (rightSingleChar._1_1_ == '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x7d6,"(!previousSurrogatePart)","!previousSurrogatePart");
          if (!bVar4) goto LAB_00eccb4d;
          *puVar5 = 0;
        }
      }
      else {
        if ((EVar9 == L'\0') && (this->inputLim <= pEVar1)) {
          Fail(this,-0x7ff5ec65);
          return;
        }
        if (this->inputLim <= pEVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar4) goto LAB_00eccb4d;
          *puVar5 = 0;
        }
        pEVar2 = this->next;
        this->next = pEVar2 + 1;
        EVar9 = *pEVar2;
        uVar8 = (ulong)(ushort)EVar9;
        if (uVar8 < 0x100) {
          bVar4 = (bool)((ASCIIChars::classes[uVar8] & 2) >> 1);
        }
        else {
          bVar4 = (EVar9 & 0xfffeU) == 0x2028;
        }
        if (bVar4 != false) {
          Fail(this,-0x7ff5fc0c);
        }
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          TrackIfSurrogatePair
                    (this,(uint)(ushort)EVar9,pEVar1,
                     (uint32)((ulong)((long)this->next - (long)pEVar1) >> 1));
        }
      }
      uVar7 = (uint)uVar8;
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
        if ((codePointValue != 0xffffffff) && (uVar7 != 0xffffffff)) {
          if (0xffff < codePointValue) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7e7,"(pendingRangeStart < 0x10000)","pendingRangeStart < 0x10000")
            ;
            if (!bVar4) goto LAB_00eccb4d;
            *puVar5 = 0;
          }
          if (_ignore != 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7e8,"(pendingRangeEnd == INVALID_CODEPOINT)",
                               "pendingRangeEnd == INVALID_CODEPOINT");
            if (!bVar4) goto LAB_00eccb4d;
            *puVar5 = 0;
          }
          if (uVar7 < codePointValue) {
            Fail(this,-0x7ff5ec63);
          }
          uVar8 = 0xffffffff;
          goto LAB_00ecc96a;
        }
      }
      else if (codePointValue == 0xffffffff) {
LAB_00ecc96a:
        codePointValue = 0xffffffff;
      }
      else {
        if ((uVar7 & _ignore) == 0xffffffff) {
          uVar8 = 0xffffffff;
        }
        else {
          if (this->next == this->positionAfterLastSurrogate) {
            cVar6 = this->valueOfLastSurrogate;
            uVar8 = 0xffffffff;
            if (rightSingleChar._1_1_ == '\x01') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x7f8,"(!previousSurrogatePart)","!previousSurrogatePart");
              if (!bVar4) goto LAB_00eccb4d;
              *puVar5 = 0;
            }
          }
          else {
            if (this->inputLim < this->next) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar4) goto LAB_00eccb4d;
              *puVar5 = 0;
            }
            cVar6 = _ignore;
            if (_ignore == 0xffffffff) {
              cVar6 = uVar7;
            }
            if (*this->next != L']') {
              cVar6 = _ignore;
            }
          }
          if (cVar6 == 0xffffffff) {
            _ignore = (uint)uVar8;
            goto LAB_00ecca79;
          }
          if (codePointValue < 0x10000) {
            local_3c = (char16)codePointValue;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue,&local_40,&local_3c);
          }
          if (cVar6 < 0x10000) {
            local_3a = (char16)cVar6;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(cVar6,&local_3a,&local_40);
          }
          if ((cVar6 < codePointValue) && ((cVar6 | codePointValue) < 0x10000)) {
            Fail(this,-0x7ff5ec63);
          }
          else {
            if ((ushort)local_3a < (ushort)local_3c) {
              DeferredFailIfNotUnicode(this,-0x7ff5ec63);
            }
            if (cVar6 < codePointValue) {
              DeferredFailIfUnicode(this,-0x7ff5ec63);
            }
          }
          codePointValue = 0xffffffff;
        }
        _ignore = 0xffffffff;
      }
LAB_00ecca79:
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00eccb4d;
        *puVar5 = 0;
      }
      EVar9 = *this->next;
    } while (EVar9 != L']');
    if (_ignore != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x83a,"(pendingRangeEnd == INVALID_CODEPOINT)",
                         "pendingRangeEnd == INVALID_CODEPOINT");
      if (!bVar4) {
LAB_00eccb4d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::CharacterClassPass0()
    {
        // Could be terminating 0
        if (ECLookahead() == '^')
            ECConsume();

        EncodedChar nextChar = ECLookahead();
        const EncodedChar* current;
        codepoint_t lastCodepoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        codepoint_t pendingRangeEnd = INVALID_CODEPOINT;
        bool previousSurrogatePart = false;

        while(nextChar != ']')
        {
            current = next;

            if (nextChar == '\0' && IsEOF())
            {
                // Report as unclosed '['
                Fail(JSERR_RegExpNoBracket);
                return;
            } // Otherwise embedded '\0' is ok
            else if (nextChar == '\\')
            {
                // Consume, as classescapepass0 expects for it to be consumed
                Char outChar = NextChar();
                // If previousSurrogatePart = true upon leaving this method, then we are going to pass through here twice
                // This is because \u{} escape sequence was encountered that is actually 2 characters, the second time we will pass consuming entire character
                if (ClassEscapePass0(outChar, previousSurrogatePart))
                {
                    lastCodepoint = outChar;
                }
                else
                {
                    // Last codepoint isn't a singleton, so no codepoint tracking for the sake of ranges is needed.
                    lastCodepoint = INVALID_CODEPOINT;
                    // Unless we have a possible range end, cancel our range tracking.
                    if (pendingRangeEnd == INVALID_CODEPOINT)
                    {
                        pendingRangeStart = INVALID_CODEPOINT;
                    }
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || lastCodepoint == INVALID_CODEPOINT)
                {
                    // '-' is the upper part of the range, with pendingRangeStart codepoint is the lower. Set  lastCodePoint to '-' to check at the end of the while statement
                    // OR
                    // '-' is just a char, consume it and set as last char
                    lastCodepoint = NextChar();
                }
                else
                {
                    pendingRangeStart = this->next == this->positionAfterLastSurrogate
                        ? this->valueOfLastSurrogate
                        : lastCodepoint;
                    lastCodepoint = INVALID_CODEPOINT;
                    NextChar();
                }

                // If we have a pattern of the form [\ud800-\udfff], we need this to be interpreted as a range.
                // In order to achieve this, the two variables that we use to track surrogate pairs, namely
                // tempLocationOfSurrogatePair and previousSurrogatePart, need to be in a certain state.
                //
                // We need to reset tempLocationOfSurrogatePair as it points to the first Unicode escape (\ud800)
                // when we're here. We need to clear it in order not to have a surrogate pair when we process the
                // second escape (\udfff).
                //
                // previousSurrogatePart is used when we have a code point in the \u{...} extended format and the
                // character is in a supplementary plane. However, there is no need to change its value here. When
                // such an escape sequence is encountered, the first call to ClassEscapePass0() sets the variable
                // to true, but it rewinds the input back to the beginning of the escape sequence. The next
                // iteration of the loop here will again call ClassEscape0() with the same character and the
                // variable will this time be set to false. Therefore, the variable will always be false here.
                tempLocationOfSurrogatePair = nullptr;
                Assert(!previousSurrogatePart);
            }
            else
            {
                lastCodepoint = NextChar();

                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(lastCodepoint, current, (uint32)(next - current));
                }
            }

            if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
            {
                // This is much easier to handle.
                if (pendingRangeStart != INVALID_CODEPOINT && lastCodepoint != INVALID_CODEPOINT)
                {
                    Assert(pendingRangeStart < 0x10000);
                    Assert(pendingRangeEnd == INVALID_CODEPOINT);
                    if (pendingRangeStart > lastCodepoint)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    pendingRangeStart = lastCodepoint = INVALID_CODEPOINT;
                }
            }
            // We have a candidate for range end, and we have a range start.
            else if (pendingRangeStart != INVALID_CODEPOINT && (lastCodepoint != INVALID_CODEPOINT || pendingRangeEnd != INVALID_CODEPOINT))
            {
                // The following will be true at the end of each surrogate pair parse.
                // Note, the escape sequence \u{} is a two time parse, so this will be true on the second time around.
                if (this->next == this->positionAfterLastSurrogate)
                {
                    lastCodepoint = this->valueOfLastSurrogate;
                    Assert(!previousSurrogatePart);
                    pendingRangeEnd = lastCodepoint;

                    lastCodepoint = INVALID_CODEPOINT;
                }
                // If the next character is the end of range ']', then we can't have a surrogate pair.
                // The current character is the range end, if we don't already have a candidate.
                else if (ECLookahead() == ']' && pendingRangeEnd == INVALID_CODEPOINT)
                {
                    pendingRangeEnd = lastCodepoint;
                }

                //If we get here, and pendingRangeEnd is set. Then one of the above has caused it to be set, or the previous iteration of the loop.
                if (pendingRangeEnd != INVALID_CODEPOINT)
                {
                    char16 leftSingleChar, rightSingleChar, ignore;

                    if (pendingRangeStart >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeStart, &ignore, &leftSingleChar);
                    }
                    else
                    {
                        leftSingleChar = (char16)pendingRangeStart;
                    }

                    if (pendingRangeEnd >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeEnd, &rightSingleChar, &ignore);
                    }
                    else
                    {
                        rightSingleChar = (char16)pendingRangeEnd;
                    }

                    // Here it is a bit tricky, we don't know if we have a unicode option specified.
                    // If it is, then \ud800\udc00 - \ud800\udc01 is valid, otherwise invalid.
                    if (pendingRangeStart < 0x10000 && pendingRangeEnd < 0x10000 && pendingRangeStart > pendingRangeEnd)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    else
                    {
                        if(leftSingleChar > rightSingleChar)
                        {
                            DeferredFailIfNotUnicode(JSERR_RegExpBadRange);
                        }

                        if (pendingRangeStart > pendingRangeEnd)
                        {
                            DeferredFailIfUnicode(JSERR_RegExpBadRange);
                        }
                    }

                    pendingRangeStart = pendingRangeEnd = INVALID_CODEPOINT;
                }
                // The current char < 0x10000 is a candidate for the range end, but we need to iterate one more time.
                else
                {
                    pendingRangeEnd = lastCodepoint;
                }
            }
            nextChar = ECLookahead();
        }

        // We should never have a pendingRangeEnd set when we exit the loop
        Assert(pendingRangeEnd == INVALID_CODEPOINT);
    }